

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

int TIFFFetchStripThing(TIFF *tif,TIFFDirEntry *dir,uint32_t nstrips,uint64_t **lpp)

{
  TIFFReadDirEntryErr err;
  uint uVar1;
  TIFFField *pTVar2;
  uint64_t *d;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  uint64_t *local_40;
  uint64_t **local_38;
  
  uVar3 = (ulong)nstrips;
  err = TIFFReadDirEntryLong8ArrayWithLimit(tif,dir,&local_40,uVar3);
  if (err == TIFFReadDirEntryErrOk) {
    if (dir->tdir_count < uVar3) {
      local_38 = lpp;
      pTVar2 = TIFFFieldWithTag(tif,(uint)dir->tdir_tag);
      pcVar4 = getenv("LIBTIFF_STRILE_ARRAY_MAX_RESIZE_COUNT");
      if (pcVar4 == (char *)0x0) {
        uVar1 = 1000000;
      }
      else {
        uVar1 = atoi(pcVar4);
      }
      lpp = local_38;
      if (pTVar2 == (TIFFField *)0x0) {
        pcVar4 = "unknown tagname";
      }
      else {
        pcVar4 = pTVar2->field_name;
      }
      TIFFReadDirEntryOutputErr
                (tif,TIFFReadDirEntryErrCount,"TIFFFetchStripThing",pcVar4,(uint)(nstrips <= uVar1))
      ;
      if ((uVar1 < nstrips) ||
         (d = (uint64_t *)_TIFFCheckMalloc(tif,uVar3,8,"for strip array"), d == (uint64_t *)0x0)) {
        _TIFFfreeExt(tif,local_40);
        return 0;
      }
      if (dir->tdir_count == 0) {
        uVar3 = 0;
      }
      else {
        _TIFFmemcpy(d,local_40,(dir->tdir_count & 0xffffffff) << 3);
        uVar3 = (ulong)(uint)dir->tdir_count;
      }
      _TIFFmemset(d + uVar3,0,(ulong)(nstrips - (int)uVar3) << 3);
      _TIFFfreeExt(tif,local_40);
      local_40 = d;
    }
    *lpp = local_40;
    iVar5 = 1;
  }
  else {
    pTVar2 = TIFFFieldWithTag(tif,(uint)dir->tdir_tag);
    if (pTVar2 == (TIFFField *)0x0) {
      pcVar4 = "unknown tagname";
    }
    else {
      pcVar4 = pTVar2->field_name;
    }
    iVar5 = 0;
    TIFFReadDirEntryOutputErr(tif,err,"TIFFFetchStripThing",pcVar4,0);
  }
  return iVar5;
}

Assistant:

static int TIFFFetchStripThing(TIFF *tif, TIFFDirEntry *dir, uint32_t nstrips,
                               uint64_t **lpp)
{
    static const char module[] = "TIFFFetchStripThing";
    enum TIFFReadDirEntryErr err;
    uint64_t *data;
    err = TIFFReadDirEntryLong8ArrayWithLimit(tif, dir, &data, nstrips);
    if (err != TIFFReadDirEntryErrOk)
    {
        const TIFFField *fip = TIFFFieldWithTag(tif, dir->tdir_tag);
        TIFFReadDirEntryOutputErr(tif, err, module,
                                  fip ? fip->field_name : "unknown tagname", 0);
        return (0);
    }
    if (dir->tdir_count < (uint64_t)nstrips)
    {
        uint64_t *resizeddata;
        const TIFFField *fip = TIFFFieldWithTag(tif, dir->tdir_tag);
        const char *pszMax = getenv("LIBTIFF_STRILE_ARRAY_MAX_RESIZE_COUNT");
        uint32_t max_nstrips = 1000000;
        if (pszMax)
            max_nstrips = (uint32_t)atoi(pszMax);
        TIFFReadDirEntryOutputErr(tif, TIFFReadDirEntryErrCount, module,
                                  fip ? fip->field_name : "unknown tagname",
                                  (nstrips <= max_nstrips));

        if (nstrips > max_nstrips)
        {
            _TIFFfreeExt(tif, data);
            return (0);
        }

        resizeddata = (uint64_t *)_TIFFCheckMalloc(
            tif, nstrips, sizeof(uint64_t), "for strip array");
        if (resizeddata == 0)
        {
            _TIFFfreeExt(tif, data);
            return (0);
        }
        if (dir->tdir_count)
            _TIFFmemcpy(resizeddata, data,
                        (uint32_t)dir->tdir_count * sizeof(uint64_t));
        _TIFFmemset(resizeddata + (uint32_t)dir->tdir_count, 0,
                    (nstrips - (uint32_t)dir->tdir_count) * sizeof(uint64_t));
        _TIFFfreeExt(tif, data);
        data = resizeddata;
    }
    *lpp = data;
    return (1);
}